

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O0

int RqOutCompile(RqOutWorkMem *pOutWorkMem,RqOutProgram *pOutProgMem,size_t nOutProgMemSize)

{
  ulong __n;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  size_t sz;
  int local_4;
  
  __n = (long)*(int *)((long)in_RDI + 0x30) * 4 + 0x34;
  if (__n < in_RDX) {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0x121,"Not enough memory for OutProgMem.");
    local_4 = -1;
  }
  else {
    memcpy(in_RSI,in_RDI,__n);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int RqOutCompile(RqOutWorkMem* pOutWorkMem,
		 RqOutProgram* pOutProgMem,
		 size_t nOutProgMemSize)
{
	size_t sz = sizeof(*pOutProgMem) + pOutWorkMem->nESI * sizeof(pOutProgMem->ESIs[0]);
	if (sz < nOutProgMemSize) {
		errmsg("Not enough memory for OutProgMem.");
		return RQ_ERR_ENOMEM;
	}

	memcpy(pOutProgMem, pOutWorkMem, sz);
	return 0;
}